

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# r_draw_pal.cpp
# Opt level: O3

void __thiscall
swrenderer::DrawWallAdd4PalCommand::Execute(DrawWallAdd4PalCommand *this,DrawerThread *thread)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  uint32_t *puVar4;
  uint32_t *puVar5;
  ulong uVar6;
  undefined1 auVar7 [16];
  undefined8 uVar8;
  undefined8 uVar9;
  ulong uVar10;
  int iVar11;
  int pass_skip;
  uint uVar12;
  int iVar13;
  uint uVar14;
  uint8_t *puVar15;
  int i;
  long lVar16;
  ulong uVar17;
  undefined1 auVar18 [16];
  undefined4 uVar19;
  uint local_48 [4];
  undefined8 local_38;
  ulong uStack_30;
  
  iVar11 = (this->super_PalWall4Command)._count;
  iVar1 = (this->super_PalWall4Command)._fracbits;
  puVar4 = (this->super_PalWall4Command)._srcblend;
  puVar5 = (this->super_PalWall4Command)._destblend;
  uVar8 = *(undefined8 *)(this->super_PalWall4Command)._texturefrac;
  uVar9 = *(undefined8 *)((this->super_PalWall4Command)._texturefrac + 2);
  uVar17 = *(ulong *)(this->super_PalWall4Command)._iscale;
  uStack_30 = *(ulong *)((this->super_PalWall4Command)._iscale + 2);
  iVar2 = (this->super_PalWall4Command).super_DrawerCommand._dest_y;
  iVar13 = thread->pass_end_y - iVar2;
  if (iVar13 < 1) {
    iVar13 = 0;
  }
  if (iVar11 < iVar13) {
    iVar13 = iVar11;
  }
  uVar12 = thread->pass_start_y - iVar2;
  if ((int)uVar12 < 1) {
    uVar12 = 0;
  }
  uVar3 = thread->num_cores;
  iVar11 = (int)(uVar3 - (int)((iVar2 + uVar12) - thread->core) % (int)uVar3) % (int)uVar3;
  uVar6 = (long)(int)((~uVar12 + uVar3 + iVar13) - iVar11) / (long)(int)uVar3;
  uVar10 = uVar6 & 0xffffffff;
  if (0 < (int)uVar6) {
    iVar2 = (this->super_PalWall4Command)._pitch;
    uVar12 = iVar11 + uVar12;
    puVar15 = (this->super_PalWall4Command)._dest + (int)(iVar2 * uVar12);
    auVar18._4_4_ = uVar12;
    auVar18._0_4_ = uVar12;
    auVar18._8_4_ = uVar12;
    auVar18._12_4_ = uVar12;
    iVar11 = (int)(uVar17 >> 0x20);
    uVar19 = (undefined4)(uStack_30 >> 0x20);
    auVar7._4_4_ = iVar11;
    auVar7._0_4_ = iVar11;
    auVar7._8_4_ = uVar19;
    auVar7._12_4_ = uVar19;
    local_48[0] = (uint)uVar8;
    local_48[1] = (uint)((ulong)uVar8 >> 0x20);
    local_48[2] = (uint)uVar9;
    local_48[3] = (uint)((ulong)uVar9 >> 0x20);
    local_48[1] = iVar11 * uVar12 + local_48[1];
    local_48[0] = (int)((ulong)uVar12 * (uVar17 & 0xffffffff)) + local_48[0];
    local_48[3] = (int)((auVar7._8_8_ & 0xffffffff) * (ulong)uVar12) + local_48[3];
    local_48[2] = (int)((auVar18._8_8_ & 0xffffffff) * (uStack_30 & 0xffffffff)) + local_48[2];
    local_38 = CONCAT44(iVar11 * uVar3,(int)((uVar17 & 0xffffffff) * (ulong)uVar3));
    do {
      lVar16 = 0;
      do {
        uVar12 = local_48[lVar16];
        uVar17 = (ulong)(this->super_PalWall4Command)._source[lVar16]
                        [uVar12 >> ((byte)iVar1 & 0x3f)];
        if (uVar17 != 0) {
          uVar14 = puVar5[puVar15[lVar16]] +
                   puVar4[(this->super_PalWall4Command)._colormap[lVar16][uVar17]] | 0x1f07c1f;
          puVar15[lVar16] = RGB32k.All[uVar14 >> 0xf & uVar14];
        }
        local_48[lVar16] = uVar12 + *(int *)((long)&local_38 + lVar16 * 4);
        lVar16 = lVar16 + 1;
      } while (lVar16 != 4);
      puVar15 = puVar15 + (int)(iVar2 * uVar3);
      uVar12 = (int)uVar10 - 1;
      uVar10 = (ulong)uVar12;
    } while (uVar12 != 0);
  }
  return;
}

Assistant:

void DrawWallAdd4PalCommand::Execute(DrawerThread *thread)
	{
		uint8_t *dest = _dest;
		int count = _count;
		int bits = _fracbits;

		uint32_t *fg2rgb = _srcblend;
		uint32_t *bg2rgb = _destblend;

		uint32_t dc_wall_texturefrac[4] = { _texturefrac[0], _texturefrac[1], _texturefrac[2], _texturefrac[3] };
		uint32_t dc_wall_iscale[4] = { _iscale[0], _iscale[1], _iscale[2], _iscale[3] };

		count = thread->count_for_thread(_dest_y, count);
		if (count <= 0)
			return;

		int pitch = _pitch;
		int skipped = thread->skipped_by_thread(_dest_y);
		dest = thread->dest_for_thread(_dest_y, pitch, dest);
		for (int i = 0; i < 4; i++)
		{
			dc_wall_texturefrac[i] += dc_wall_iscale[i] * skipped;
			dc_wall_iscale[i] *= thread->num_cores;
		}
		pitch *= thread->num_cores;

		do
		{
			for (int i = 0; i < 4; ++i)
			{
				uint8_t pix = _source[i][dc_wall_texturefrac[i] >> bits];
				if (pix != 0)
				{
					uint32_t fg = fg2rgb[_colormap[i][pix]];
					uint32_t bg = bg2rgb[dest[i]];
					fg = (fg + bg) | 0x1f07c1f;
					dest[i] = RGB32k.All[fg & (fg >> 15)];
				}
				dc_wall_texturefrac[i] += dc_wall_iscale[i];
			}
			dest += pitch;
		} while (--count);
	}